

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaClearAttrInfos(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaAttrInfoPtr pxVar1;
  long lVar2;
  
  if (vctxt->nbAttrInfos != 0) {
    if (0 < vctxt->nbAttrInfos) {
      lVar2 = 0;
      do {
        pxVar1 = vctxt->attrInfos[lVar2];
        if ((pxVar1->flags & 1) != 0) {
          if (pxVar1->localName != (xmlChar *)0x0) {
            (*xmlFree)(pxVar1->localName);
          }
          if (pxVar1->nsName != (xmlChar *)0x0) {
            (*xmlFree)(pxVar1->nsName);
          }
        }
        if (((pxVar1->flags & 2) != 0) && (pxVar1->value != (xmlChar *)0x0)) {
          (*xmlFree)(pxVar1->value);
        }
        if (pxVar1->val != (xmlSchemaValPtr)0x0) {
          xmlSchemaFreeValue(pxVar1->val);
        }
        pxVar1->vcValue = (xmlChar *)0x0;
        pxVar1->parent = (xmlSchemaNodeInfoPtr)0x0;
        pxVar1->use = (xmlSchemaAttributeUsePtr_conflict)0x0;
        pxVar1->state = 0;
        pxVar1->metaType = 0;
        *(undefined8 *)&pxVar1->flags = 0;
        pxVar1->decl = (xmlSchemaAttributePtr)0x0;
        pxVar1->val = (xmlSchemaValPtr)0x0;
        pxVar1->typeDef = (xmlSchemaTypePtr)0x0;
        pxVar1->nsName = (xmlChar *)0x0;
        pxVar1->value = (xmlChar *)0x0;
        *(undefined8 *)&pxVar1->nodeLine = 0;
        pxVar1->localName = (xmlChar *)0x0;
        *(undefined8 *)pxVar1 = 0;
        pxVar1->node = (xmlNodePtr)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 < vctxt->nbAttrInfos);
    }
    vctxt->nbAttrInfos = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearAttrInfos(xmlSchemaValidCtxtPtr vctxt)
{
    int i;
    xmlSchemaAttrInfoPtr attr;

    if (vctxt->nbAttrInfos == 0)
	return;
    for (i = 0; i < vctxt->nbAttrInfos; i++) {
	attr = vctxt->attrInfos[i];
	if (attr->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	    if (attr->localName != NULL)
		xmlFree((xmlChar *) attr->localName);
	    if (attr->nsName != NULL)
		xmlFree((xmlChar *) attr->nsName);
	}
	if (attr->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	    if (attr->value != NULL)
		xmlFree((xmlChar *) attr->value);
	}
	if (attr->val != NULL) {
	    xmlSchemaFreeValue(attr->val);
	    attr->val = NULL;
	}
	memset(attr, 0, sizeof(xmlSchemaAttrInfo));
    }
    vctxt->nbAttrInfos = 0;
}